

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O1

JL_STATUS JlBufferAdd(JlBuffer *BufferContext,void *Data,size_t DataSize)

{
  size_t OriginalSize;
  bool bVar1;
  uint8_t *puVar2;
  JL_STATUS JVar3;
  
  JVar3 = JL_STATUS_INVALID_PARAMETER;
  if (DataSize != 0 && (Data != (void *)0x0 && BufferContext != (JlBuffer *)0x0)) {
    OriginalSize = BufferContext->BufferAllocated;
    JVar3 = JL_STATUS_SUCCESS;
    bVar1 = true;
    if (OriginalSize - BufferContext->BufferUsed < DataSize) {
      puVar2 = (uint8_t *)JlRealloc(BufferContext->Buffer,OriginalSize,OriginalSize + 0x4000);
      JVar3 = JL_STATUS_SUCCESS;
      if (puVar2 == (uint8_t *)0x0) {
        JVar3 = JL_STATUS_OUT_OF_MEMORY;
        bVar1 = false;
      }
      else {
        BufferContext->BufferAllocated = OriginalSize + 0x4000;
        BufferContext->Buffer = puVar2;
      }
    }
    if (bVar1) {
      memcpy(BufferContext->Buffer + BufferContext->BufferUsed,Data,DataSize);
      BufferContext->BufferUsed = BufferContext->BufferUsed + DataSize;
    }
  }
  return JVar3;
}

Assistant:

JL_STATUS
    JlBufferAdd
    (
        JlBuffer*       BufferContext,
        void const*     Data,
        size_t          DataSize
    )
{
    JL_STATUS jlStatus;

    if(     NULL != BufferContext
        &&  NULL != Data
        &&  0 != DataSize )
    {
        size_t amountLeft = BufferContext->BufferAllocated - BufferContext->BufferUsed;
        if( amountLeft < DataSize )
        {
            size_t   newSize = BufferContext->BufferAllocated + BUFFER_GROW_SIZE;
            uint8_t* newBuffer = JlRealloc( BufferContext->Buffer, BufferContext->BufferAllocated, newSize );

            if( NULL != newBuffer )
            {
                BufferContext->BufferAllocated = newSize;
                BufferContext->Buffer = newBuffer;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            // No need to grow buffer
            jlStatus = JL_STATUS_SUCCESS;
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Append data
            memcpy( BufferContext->Buffer + BufferContext->BufferUsed, Data, DataSize );
            BufferContext->BufferUsed += DataSize;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}